

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

nvpair_t * nvpair_allocv(char *name,int type,uint64_t data,size_t datasize,size_t nitems)

{
  size_t __n;
  int *piVar1;
  nvpair_t *pnVar2;
  
  __n = strlen(name);
  if (__n < 0x800) {
    pnVar2 = (nvpair_t *)calloc(1,__n + 0x49);
    if (pnVar2 != (nvpair_t *)0x0) {
      pnVar2->nvp_name = (char *)(pnVar2 + 1);
      memcpy(pnVar2 + 1,name,__n);
      *(undefined1 *)((long)&pnVar2[1].nvp_magic + __n) = 0;
      pnVar2->nvp_type = type;
      pnVar2->nvp_data = data;
      pnVar2->nvp_datasize = datasize;
      pnVar2->nvp_nitems = nitems;
      pnVar2->nvp_magic = 0x6e7670;
      return pnVar2;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x24;
  }
  return (nvpair_t *)0x0;
}

Assistant:

static nvpair_t *
nvpair_allocv(const char *name, int type, uint64_t data, size_t datasize,
    size_t nitems)
{
	nvpair_t *nvp;
	size_t namelen;

	PJDLOG_ASSERT(type >= NV_TYPE_FIRST && type <= NV_TYPE_LAST);

	namelen = strlen(name);
	if (namelen >= NV_NAME_MAX) {
		ERRNO_SET(ENAMETOOLONG);
		return (NULL);
	}

	nvp = nv_calloc(1, sizeof(*nvp) + namelen + 1);
	if (nvp != NULL) {
		nvp->nvp_name = (char *)(nvp + 1);
		memcpy(nvp->nvp_name, name, namelen);
		nvp->nvp_name[namelen] = '\0';
		nvp->nvp_type = type;
		nvp->nvp_data = data;
		nvp->nvp_datasize = datasize;
		nvp->nvp_nitems = nitems;
		nvp->nvp_magic = NVPAIR_MAGIC;
	}

	return (nvp);
}